

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

DWORD __thiscall FArchive::ReadCount(FArchive *this)

{
  byte bVar1;
  uint local_18;
  int ofs;
  DWORD count;
  BYTE in;
  FArchive *this_local;
  
  local_18 = 0;
  bVar1 = 0;
  _count = this;
  do {
    (*this->_vptr_FArchive[3])(this,(long)&ofs + 3,1);
    local_18 = (ofs._3_1_ & 0x7f) << (bVar1 & 0x1f) | local_18;
    bVar1 = bVar1 + 7;
  } while ((ofs._3_1_ & 0x80) != 0);
  return local_18;
}

Assistant:

DWORD FArchive::ReadCount ()
{
	BYTE in;
	DWORD count = 0;
	int ofs = 0;

	do
	{
		Read (&in, sizeof(BYTE));
		count |= (in & 0x7f) << ofs;
		ofs += 7;
	} while (in & 0x80);

	return count;
}